

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

int __thiscall rcg::Device::close(Device *this,int __fd)

{
  int extraout_EAX;
  element_type *peVar1;
  element_type *this_00;
  int __fd_00;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  lock_guard<std::mutex> *in_stack_ffffffffffffff70;
  shared_ptr<GenApi_3_4::CNodeMapRef> *this_01;
  __shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_ffffffffffffff80;
  undefined1 local_60 [48];
  shared_ptr<GenApi_3_4::CNodeMapRef> local_30 [2];
  Device *local_8;
  
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if ((0 < this->n_open) && (this->n_open = this->n_open + -1, this->n_open == 0)) {
    std::__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>::reset
              (in_stack_ffffffffffffff80);
    if (this->event != (void *)0x0) {
      peVar1 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x116d62);
      (*peVar1->GCUnregisterEvent)(this->dev,5);
    }
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x116dae);
    (*peVar1->DevClose)(this->dev);
    this->dev = (void *)0x0;
    this->rp = (void *)0x0;
    this->event = (void *)0x0;
    this_01 = local_30;
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr(this_01,in_stack_ffffffffffffff68);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
              (this_01,(shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff68);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x116e23);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr(this_01,in_stack_ffffffffffffff68);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
              (this_01,(shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff68);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x116e57);
    std::shared_ptr<rcg::CPort>::shared_ptr
              ((shared_ptr<rcg::CPort> *)this_01,in_stack_ffffffffffffff68);
    std::shared_ptr<rcg::CPort>::operator=
              ((shared_ptr<rcg::CPort> *)this_01,(shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff68
              );
    std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x116e8b);
    std::shared_ptr<rcg::CPort>::shared_ptr
              ((shared_ptr<rcg::CPort> *)this_01,in_stack_ffffffffffffff68);
    __fd_00 = (int)local_60;
    std::shared_ptr<rcg::CPort>::operator=
              ((shared_ptr<rcg::CPort> *)this_01,(shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff68
              );
    std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x116ebf);
    this_00 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x116ecd);
    Interface::close(this_00,__fd_00);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x116ee8);
  return extraout_EAX;
}

Assistant:

void Device::close()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      eventadapter.reset();

      if (event)
      {
        gentl->GCUnregisterEvent(dev, GenTL::EVENT_MODULE);
      }

      gentl->DevClose(dev);
      dev=0;
      rp=0;
      event=0;

      nodemap=0;
      rnodemap=0;

      cport=0;
      rport=0;

      parent->close();
    }
  }
}